

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O3

void ngx_slab_free_locked(ngx_slab_pool_t *pool,void *p)

{
  ngx_slab_page_t *page;
  ngx_uint_t *pnVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  sbyte sVar5;
  ulong uVar6;
  char *text;
  ulong *puVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab free: %p",p);
  }
  if ((p < pool->start) || (pool->end < p)) {
    text = "ngx_slab_free(): outside of pool";
    goto LAB_0011ea40;
  }
  page = pool->pages + ((long)p - (long)pool->start >> ((byte)ngx_pagesize_shift & 0x3f));
  uVar4 = page->slab;
  switch((uint)page->prev & 3) {
  case 0:
    if ((ngx_pagesize - 1 & (ulong)p) == 0) {
      if ((long)uVar4 < 0) {
        if (uVar4 != 0xffffffffffffffff) {
          ngx_slab_free_pages(pool,page,uVar4 & 0x7fffffffffffffff);
          return;
        }
        text = "ngx_slab_free(): pointer to wrong page";
      }
      else {
        text = "ngx_slab_free(): page is already free";
      }
      goto LAB_0011ea40;
    }
    break;
  case 1:
    uVar9 = (uint)uVar4 & 0xf;
    sVar5 = (sbyte)uVar9;
    if ((~(-1 << sVar5) & (uint)p) == 0) {
      bVar2 = (char)((ngx_pagesize - 1 & (ulong)p) >> sVar5) + 0x20;
      if ((uVar4 >> ((ulong)bVar2 & 0x3f) & 1) != 0) {
        lVar10 = (ulong)uVar9 - pool->min_shift;
        if (page->next == (ngx_slab_page_t *)0x0) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar10 * 0x18 + 0x90 | 1;
          page->next->prev = (ulong)page | 1;
        }
        uVar4 = uVar4 & ~(1L << (bVar2 & 0x3f));
        page->slab = uVar4;
        if (uVar4 >> 0x20 == 0) {
          ngx_slab_free_pages(pool,page,1);
          pool->stats[lVar10].total = pool->stats[lVar10].total - (ngx_pagesize >> sVar5);
        }
LAB_0011ed56:
        pnVar1 = &pool->stats[lVar10].used;
        *pnVar1 = *pnVar1 - 1;
        return;
      }
LAB_0011ed72:
      text = "ngx_slab_free(): chunk is already free";
      goto LAB_0011ea40;
    }
    break;
  case 2:
    uVar3 = 1L << ((byte)((ngx_pagesize - 1 & (ulong)p) >> ((byte)ngx_slab_exact_shift & 0x3f)) &
                  0x3f);
    if ((ngx_slab_exact_size - 1 & (ulong)p) == 0) {
      if ((uVar3 & uVar4) != 0) {
        lVar10 = ngx_slab_exact_shift - pool->min_shift;
        if (uVar4 == 0xffffffffffffffff) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar10 * 0x18 + 0x90 | 2;
          page->next->prev = (ulong)page | 2;
        }
        uVar4 = uVar4 & ~uVar3;
        page->slab = uVar4;
        if (uVar4 == 0) {
          ngx_slab_free_pages(pool,page,1);
          pool->stats[lVar10].total = pool->stats[lVar10].total - 0x40;
        }
        goto LAB_0011ed56;
      }
      goto LAB_0011ed72;
    }
    break;
  case 3:
    uVar9 = (uint)uVar4 & 0xf;
    sVar5 = (sbyte)uVar9;
    if ((~(-1 << sVar5) & (uint)p) == 0) {
      uVar3 = (ngx_pagesize - 1 & (ulong)p) >> sVar5;
      uVar6 = uVar3 >> 6;
      puVar7 = (ulong *)(-ngx_pagesize & (ulong)p);
      uVar4 = puVar7[uVar6];
      if ((uVar4 >> (uVar3 & 0x3f) & 1) != 0) {
        lVar10 = (ulong)uVar9 - pool->min_shift;
        if (page->next == (ngx_slab_page_t *)0x0) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar10 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar10 * 0x18 + 0x90 | 3;
          page->next->prev = (ulong)page | 3;
          uVar4 = puVar7[uVar6];
        }
        puVar7[uVar6] = ~(1L << ((byte)uVar3 & 0x3f)) & uVar4;
        uVar4 = ngx_pagesize >> sVar5;
        uVar3 = uVar4 >> sVar5 + 3;
        lVar8 = uVar3 + (uVar3 == 0);
        if (*puVar7 >> ((byte)lVar8 & 0x3f) == 0) {
          if (0x7f < uVar4) {
            uVar3 = 1;
            do {
              if (puVar7[uVar3] != 0) goto LAB_0011ed56;
              uVar3 = uVar3 + 1;
            } while (uVar4 >> 6 != uVar3);
          }
          ngx_slab_free_pages(pool,page,1);
          pool->stats[lVar10].total = pool->stats[lVar10].total + (lVar8 - (ngx_pagesize >> sVar5));
        }
        goto LAB_0011ed56;
      }
      goto LAB_0011ed72;
    }
  }
  text = "ngx_slab_free(): pointer to wrong chunk";
LAB_0011ea40:
  ngx_slab_error(pool,2,text);
  return;
}

Assistant:

void
ngx_slab_free_locked(ngx_slab_pool_t *pool, void *p)
{
    size_t            size;
    uintptr_t         slab, m, *bitmap;
    ngx_uint_t        i, n, type, slot, shift, map;
    ngx_slab_page_t  *slots, *page;

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0, "slab free: %p", p);

    if ((u_char *) p < pool->start || (u_char *) p > pool->end) {
        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_free(): outside of pool");
        goto fail;
    }

    n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
    page = &pool->pages[n];
    slab = page->slab;
    type = ngx_slab_page_type(page);

    switch (type) {

    case NGX_SLAB_SMALL:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        n = ((uintptr_t) p & (ngx_pagesize - 1)) >> shift;
        m = (uintptr_t) 1 << (n % (sizeof(uintptr_t) * 8));
        n /= sizeof(uintptr_t) * 8;
        bitmap = (uintptr_t *)
                             ((uintptr_t) p & ~((uintptr_t) ngx_pagesize - 1));

        if (bitmap[n] & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;
                page->next->prev = (uintptr_t) page | NGX_SLAB_SMALL;
            }

            bitmap[n] &= ~m;

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            if (bitmap[0] & ~(((uintptr_t) 1 << n) - 1)) {
                goto done;
            }

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                if (bitmap[i]) {
                    goto done;
                }
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= (ngx_pagesize >> shift) - n;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_EXACT:

        m = (uintptr_t) 1 <<
                (((uintptr_t) p & (ngx_pagesize - 1)) >> ngx_slab_exact_shift);
        size = ngx_slab_exact_size;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        if (slab & m) {
            slot = ngx_slab_exact_shift - pool->min_shift;

            if (slab == NGX_SLAB_BUSY) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;
                page->next->prev = (uintptr_t) page | NGX_SLAB_EXACT;
            }

            page->slab &= ~m;

            if (page->slab) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= sizeof(uintptr_t) * 8;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_BIG:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        m = (uintptr_t) 1 << ((((uintptr_t) p & (ngx_pagesize - 1)) >> shift)
                              + NGX_SLAB_MAP_SHIFT);

        if (slab & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;
                page->next->prev = (uintptr_t) page | NGX_SLAB_BIG;
            }

            page->slab &= ~m;

            if (page->slab & NGX_SLAB_MAP_MASK) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= ngx_pagesize >> shift;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_PAGE:

        if ((uintptr_t) p & (ngx_pagesize - 1)) {
            goto wrong_chunk;
        }

        if (!(slab & NGX_SLAB_PAGE_START)) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): page is already free");
            goto fail;
        }

        if (slab == NGX_SLAB_PAGE_BUSY) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): pointer to wrong page");
            goto fail;
        }

        n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
        size = slab & ~NGX_SLAB_PAGE_START;

        ngx_slab_free_pages(pool, &pool->pages[n], size);

        ngx_slab_junk(p, size << ngx_pagesize_shift);

        return;
    }

    /* not reached */

    return;

done:

    pool->stats[slot].used--;

    ngx_slab_junk(p, size);

    return;

wrong_chunk:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): pointer to wrong chunk");

    goto fail;

chunk_already_free:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): chunk is already free");

fail:

    return;
}